

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O3

void lysc_node_free_(lysf_ctx *ctx,lysc_node *node)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  lysc_node *plVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  lysc_when **pplVar12;
  lysc_must *plVar13;
  lysc_node *plVar14;
  long lVar15;
  long lVar16;
  lys_module *plVar17;
  lysc_ext_instance *plVar18;
  char *pcVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  void *pvVar23;
  
  lydict_remove(ctx->ctx,node->name);
  lydict_remove(ctx->ctx,node->dsc);
  lydict_remove(ctx->ctx,node->ref);
  uVar1 = node->nodetype;
  if (uVar1 < 0x80) {
    if (0xf < uVar1) {
      if (uVar1 == 0x10) {
        plVar14 = *(lysc_node **)(node + 1);
        while (plVar14 != (lysc_node *)0x0) {
          plVar7 = plVar14->next;
          lysc_node_free_(ctx,plVar14);
          plVar14 = plVar7;
        }
        plVar14 = node[1].parent;
        if (plVar14 != (lysc_node *)0x0) {
          pvVar23 = (void *)0xffffffffffffffff;
          lVar21 = 0;
          do {
            pvVar23 = (void *)((long)pvVar23 + 1);
            if (plVar14[-1].priv <= pvVar23) {
              free(&plVar14[-1].priv);
              break;
            }
            lVar20 = lVar21 + -4;
            lVar21 = lVar21 + 8;
            lysc_when_free(ctx,(lysc_when **)(plVar14->hash + lVar20));
            plVar14 = node[1].parent;
          } while (plVar14 != (lysc_node *)0x0);
        }
        plVar17 = node[1].module;
        if (plVar17 != (lys_module *)0x0) {
          uVar22 = 0xffffffffffffffff;
          lVar21 = 0;
          do {
            uVar22 = uVar22 + 1;
            uVar9._0_1_ = plVar17[-1].implemented;
            uVar9._1_1_ = plVar17[-1].to_compile;
            uVar9._2_1_ = plVar17[-1].latest_revision;
            uVar9._3_5_ = *(undefined5 *)&plVar17[-1].field_0x7b;
            if (uVar9 <= uVar22) {
              free(&plVar17[-1].implemented);
              break;
            }
            plVar13 = (lysc_must *)((long)&plVar17->ctx + lVar21);
            lVar21 = lVar21 + 0x38;
            lysc_must_free(ctx,plVar13);
            plVar17 = node[1].module;
          } while (plVar17 != (lys_module *)0x0);
        }
        pcVar19 = node[1].name;
        if (pcVar19 != (char *)0x0) {
          uVar22 = 0;
          do {
            if (*(ulong *)(pcVar19 + -8) <= uVar22) {
              free(pcVar19 + -8);
              break;
            }
            if (*(long *)(pcVar19 + uVar22 * 8) != 0) {
              free((void *)(*(long *)(pcVar19 + uVar22 * 8) + -8));
              pcVar19 = node[1].name;
            }
            uVar22 = uVar22 + 1;
          } while (pcVar19 != (char *)0x0);
        }
        plVar14 = node[1].next;
        while (plVar14 != (lysc_node *)0x0) {
          plVar7 = plVar14->next;
          lysc_node_free_(ctx,plVar14);
          plVar14 = plVar7;
        }
        bVar11 = true;
        plVar14 = node[1].prev;
        while (plVar14 != (lysc_node *)0x0) {
          plVar7 = plVar14->next;
          lysc_node_free_(ctx,plVar14);
          plVar14 = plVar7;
        }
        goto LAB_0015d865;
      }
      if ((uVar1 == 0x20) || (uVar1 == 0x60)) {
        plVar17 = node[1].module;
        if (plVar17 != (lys_module *)0x0) {
          uVar22 = 0xffffffffffffffff;
          lVar21 = 0;
          do {
            uVar22 = uVar22 + 1;
            uVar2._0_1_ = plVar17[-1].implemented;
            uVar2._1_1_ = plVar17[-1].to_compile;
            uVar2._2_1_ = plVar17[-1].latest_revision;
            uVar2._3_5_ = *(undefined5 *)&plVar17[-1].field_0x7b;
            if (uVar2 <= uVar22) {
              free(&plVar17[-1].implemented);
              break;
            }
            pplVar12 = (lysc_when **)((long)&plVar17->ctx + lVar21);
            lVar21 = lVar21 + 8;
            lysc_when_free(ctx,pplVar12);
            plVar17 = node[1].module;
          } while (plVar17 != (lys_module *)0x0);
        }
        lVar20._0_2_ = node[1].nodetype;
        lVar20._2_2_ = node[1].flags;
        lVar20._4_1_ = node[1].hash[0];
        lVar20._5_1_ = node[1].hash[1];
        lVar20._6_1_ = node[1].hash[2];
        lVar20._7_1_ = node[1].hash[3];
        bVar11 = true;
        if (lVar20 != 0) {
          uVar22 = 0xffffffffffffffff;
          lVar21 = 0;
          do {
            uVar22 = uVar22 + 1;
            if (*(ulong *)(lVar20 + -8) <= uVar22) {
              plVar14 = (lysc_node *)(lVar20 + -8);
              goto LAB_0015d6b4;
            }
            plVar13 = (lysc_must *)(lVar20 + lVar21);
            lVar21 = lVar21 + 0x38;
            lysc_must_free(ctx,plVar13);
            lVar20._0_2_ = node[1].nodetype;
            lVar20._2_2_ = node[1].flags;
            lVar20._4_1_ = node[1].hash[0];
            lVar20._5_1_ = node[1].hash[1];
            lVar20._6_1_ = node[1].hash[2];
            lVar20._7_1_ = node[1].hash[3];
          } while (lVar20 != 0);
        }
        goto LAB_0015d865;
      }
      goto switchD_0015d17d_caseD_3;
    }
    switch(uVar1) {
    case 1:
      lysc_node_container_free(ctx,(lysc_node_container *)node);
      goto LAB_0015d472;
    case 2:
      plVar17 = node[1].module;
      if (plVar17 != (lys_module *)0x0) {
        uVar22 = 0xffffffffffffffff;
        lVar21 = 0;
        do {
          uVar22 = uVar22 + 1;
          uVar6._0_1_ = plVar17[-1].implemented;
          uVar6._1_1_ = plVar17[-1].to_compile;
          uVar6._2_1_ = plVar17[-1].latest_revision;
          uVar6._3_5_ = *(undefined5 *)&plVar17[-1].field_0x7b;
          if (uVar6 <= uVar22) {
            free(&plVar17[-1].implemented);
            break;
          }
          pplVar12 = (lysc_when **)((long)&plVar17->ctx + lVar21);
          lVar21 = lVar21 + 8;
          lysc_when_free(ctx,pplVar12);
          plVar17 = node[1].module;
        } while (plVar17 != (lys_module *)0x0);
      }
      bVar11 = true;
      plVar14 = *(lysc_node **)(node + 1);
      while (plVar14 != (lysc_node *)0x0) {
        plVar7 = plVar14->next;
        lysc_node_free_(ctx,plVar14);
        plVar14 = plVar7;
      }
      break;
    default:
      goto switchD_0015d17d_caseD_3;
    case 4:
      plVar17 = node[1].module;
      if (plVar17 != (lys_module *)0x0) {
        uVar22 = 0xffffffffffffffff;
        lVar21 = 0;
        do {
          uVar22 = uVar22 + 1;
          uVar5._0_1_ = plVar17[-1].implemented;
          uVar5._1_1_ = plVar17[-1].to_compile;
          uVar5._2_1_ = plVar17[-1].latest_revision;
          uVar5._3_5_ = *(undefined5 *)&plVar17[-1].field_0x7b;
          if (uVar5 <= uVar22) {
            free(&plVar17[-1].implemented);
            break;
          }
          pplVar12 = (lysc_when **)((long)&plVar17->ctx + lVar21);
          lVar21 = lVar21 + 8;
          lysc_when_free(ctx,pplVar12);
          plVar17 = node[1].module;
        } while (plVar17 != (lys_module *)0x0);
      }
      lVar16._0_2_ = node[1].nodetype;
      lVar16._2_2_ = node[1].flags;
      lVar16._4_1_ = node[1].hash[0];
      lVar16._5_1_ = node[1].hash[1];
      lVar16._6_1_ = node[1].hash[2];
      lVar16._7_1_ = node[1].hash[3];
      if (lVar16 != 0) {
        uVar22 = 0xffffffffffffffff;
        lVar21 = 0;
        do {
          uVar22 = uVar22 + 1;
          if (*(ulong *)(lVar16 + -8) <= uVar22) {
            free((void *)(lVar16 + -8));
            break;
          }
          plVar13 = (lysc_must *)(lVar16 + lVar21);
          lVar21 = lVar21 + 0x38;
          lysc_must_free(ctx,plVar13);
          lVar16._0_2_ = node[1].nodetype;
          lVar16._2_2_ = node[1].flags;
          lVar16._4_1_ = node[1].hash[0];
          lVar16._5_1_ = node[1].hash[1];
          lVar16._6_1_ = node[1].hash[2];
          lVar16._7_1_ = node[1].hash[3];
        } while (lVar16 != 0);
      }
      if (node[1].parent != (lysc_node *)0x0) {
        lysc_type_free(ctx,(lysc_type *)node[1].parent);
      }
      lydict_remove(ctx->ctx,(char *)node[1].next);
      bVar11 = true;
      if (node[1].prev != (lysc_node *)0x0) {
        (**(code **)((node[1].prev)->module->revision + 0x38))(ctx->ctx);
        lysc_type_free(ctx,(lysc_type *)(node[1].prev)->module);
        plVar14 = node[1].prev;
LAB_0015d6b4:
        bVar11 = true;
        free(plVar14);
      }
      break;
    case 8:
      plVar17 = node[1].module;
      if (plVar17 != (lys_module *)0x0) {
        uVar22 = 0xffffffffffffffff;
        lVar21 = 0;
        do {
          uVar22 = uVar22 + 1;
          uVar4._0_1_ = plVar17[-1].implemented;
          uVar4._1_1_ = plVar17[-1].to_compile;
          uVar4._2_1_ = plVar17[-1].latest_revision;
          uVar4._3_5_ = *(undefined5 *)&plVar17[-1].field_0x7b;
          if (uVar4 <= uVar22) {
            free(&plVar17[-1].implemented);
            break;
          }
          pplVar12 = (lysc_when **)((long)&plVar17->ctx + lVar21);
          lVar21 = lVar21 + 8;
          lysc_when_free(ctx,pplVar12);
          plVar17 = node[1].module;
        } while (plVar17 != (lys_module *)0x0);
      }
      lVar15._0_2_ = node[1].nodetype;
      lVar15._2_2_ = node[1].flags;
      lVar15._4_1_ = node[1].hash[0];
      lVar15._5_1_ = node[1].hash[1];
      lVar15._6_1_ = node[1].hash[2];
      lVar15._7_1_ = node[1].hash[3];
      if (lVar15 != 0) {
        uVar22 = 0xffffffffffffffff;
        lVar21 = 0;
        do {
          uVar22 = uVar22 + 1;
          if (*(ulong *)(lVar15 + -8) <= uVar22) {
            free((void *)(lVar15 + -8));
            break;
          }
          plVar13 = (lysc_must *)(lVar15 + lVar21);
          lVar21 = lVar21 + 0x38;
          lysc_must_free(ctx,plVar13);
          lVar15._0_2_ = node[1].nodetype;
          lVar15._2_2_ = node[1].flags;
          lVar15._4_1_ = node[1].hash[0];
          lVar15._5_1_ = node[1].hash[1];
          lVar15._6_1_ = node[1].hash[2];
          lVar15._7_1_ = node[1].hash[3];
        } while (lVar15 != 0);
      }
      if (node[1].parent != (lysc_node *)0x0) {
        lysc_type_free(ctx,(lysc_type *)node[1].parent);
      }
      lydict_remove(ctx->ctx,(char *)node[1].next);
      plVar14 = node[1].prev;
      bVar11 = true;
      if (plVar14 != (lysc_node *)0x0) {
        pvVar23 = (void *)0x0;
        do {
          if (plVar14[-1].priv <= pvVar23) {
            plVar14 = (lysc_node *)&plVar14[-1].priv;
            goto LAB_0015d6b4;
          }
          (**(code **)(*(long *)(*(long *)(*(long *)(plVar14->hash + (long)pvVar23 * 8 + -4) + 8) +
                                0x10) + 0x38))(ctx->ctx);
          lysc_type_free(ctx,*(lysc_type **)
                              (*(long *)((node[1].prev)->hash + (long)pvVar23 * 8 + -4) + 8));
          free(*(void **)((node[1].prev)->hash + (long)pvVar23 * 8 + -4));
          pvVar23 = (void *)((long)pvVar23 + 1);
          plVar14 = node[1].prev;
        } while (plVar14 != (lysc_node *)0x0);
      }
    }
  }
  else {
    if (uVar1 < 0x400) {
      if (uVar1 == 0x80) {
        plVar17 = node[1].module;
        if (plVar17 != (lys_module *)0x0) {
          uVar22 = 0xffffffffffffffff;
          lVar21 = 0;
          do {
            uVar22 = uVar22 + 1;
            uVar8._0_1_ = plVar17[-1].implemented;
            uVar8._1_1_ = plVar17[-1].to_compile;
            uVar8._2_1_ = plVar17[-1].latest_revision;
            uVar8._3_5_ = *(undefined5 *)&plVar17[-1].field_0x7b;
            if (uVar8 <= uVar22) {
              free(&plVar17[-1].implemented);
              break;
            }
            pplVar12 = (lysc_when **)((long)&plVar17->ctx + lVar21);
            lVar21 = lVar21 + 8;
            lysc_when_free(ctx,pplVar12);
            plVar17 = node[1].module;
          } while (plVar17 != (lys_module *)0x0);
        }
        bVar11 = true;
        plVar14 = *(lysc_node **)(node + 1);
        while (plVar14 != (lysc_node *)0x0) {
          plVar7 = plVar14->next;
          lysc_node_free_(ctx,plVar14);
          plVar14 = plVar7;
        }
        goto LAB_0015d865;
      }
      if ((uVar1 == 0x100) || (uVar1 == 0x200)) {
        lVar21._0_2_ = node[1].nodetype;
        lVar21._2_2_ = node[1].flags;
        lVar21._4_1_ = node[1].hash[0];
        lVar21._5_1_ = node[1].hash[1];
        lVar21._6_1_ = node[1].hash[2];
        lVar21._7_1_ = node[1].hash[3];
        if (lVar21 != 0) {
          uVar22 = 0xffffffffffffffff;
          lVar20 = 0;
          do {
            uVar22 = uVar22 + 1;
            if (*(ulong *)(lVar21 + -8) <= uVar22) {
              free((void *)(lVar21 + -8));
              break;
            }
            pplVar12 = (lysc_when **)(lVar21 + lVar20);
            lVar20 = lVar20 + 8;
            lysc_when_free(ctx,pplVar12);
            lVar21._0_2_ = node[1].nodetype;
            lVar21._2_2_ = node[1].flags;
            lVar21._4_1_ = node[1].hash[0];
            lVar21._5_1_ = node[1].hash[1];
            lVar21._6_1_ = node[1].hash[2];
            lVar21._7_1_ = node[1].hash[3];
          } while (lVar21 != 0);
        }
        if (*(short *)&node[1].module != 0) {
          lysc_node_free_(ctx,(lysc_node *)&node[1].module);
        }
        bVar11 = true;
        if (*(short *)&node[2].next != 0) {
          lysc_node_free_(ctx,(lysc_node *)&node[2].next);
        }
        goto LAB_0015d865;
      }
    }
    else {
      if ((uVar1 == 0x2000) || (uVar1 == 0x1000)) {
        plVar17 = node[1].module;
        if (plVar17 != (lys_module *)0x0) {
          uVar22 = 0xffffffffffffffff;
          lVar21 = 0;
          do {
            uVar22 = uVar22 + 1;
            uVar3._0_1_ = plVar17[-1].implemented;
            uVar3._1_1_ = plVar17[-1].to_compile;
            uVar3._2_1_ = plVar17[-1].latest_revision;
            uVar3._3_5_ = *(undefined5 *)&plVar17[-1].field_0x7b;
            if (uVar3 <= uVar22) {
              free(&plVar17[-1].implemented);
              break;
            }
            plVar13 = (lysc_must *)((long)&plVar17->ctx + lVar21);
            lVar21 = lVar21 + 0x38;
            lysc_must_free(ctx,plVar13);
            plVar17 = node[1].module;
          } while (plVar17 != (lys_module *)0x0);
        }
        plVar14 = *(lysc_node **)(node + 1);
        while (plVar14 != (lysc_node *)0x0) {
          plVar7 = plVar14->next;
          lysc_node_free_(ctx,plVar14);
          plVar14 = plVar7;
        }
        bVar11 = false;
        goto LAB_0015d865;
      }
      if (uVar1 == 0x400) {
        plVar14 = node[1].parent;
        if (plVar14 != (lysc_node *)0x0) {
          pvVar23 = (void *)0xffffffffffffffff;
          lVar21 = 0;
          do {
            pvVar23 = (void *)((long)pvVar23 + 1);
            if (plVar14[-1].priv <= pvVar23) {
              free(&plVar14[-1].priv);
              break;
            }
            lVar20 = lVar21 + -4;
            lVar21 = lVar21 + 8;
            lysc_when_free(ctx,(lysc_when **)(plVar14->hash + lVar20));
            plVar14 = node[1].parent;
          } while (plVar14 != (lysc_node *)0x0);
        }
        plVar17 = node[1].module;
        if (plVar17 != (lys_module *)0x0) {
          uVar22 = 0xffffffffffffffff;
          lVar21 = 0;
          do {
            uVar22 = uVar22 + 1;
            uVar10._0_1_ = plVar17[-1].implemented;
            uVar10._1_1_ = plVar17[-1].to_compile;
            uVar10._2_1_ = plVar17[-1].latest_revision;
            uVar10._3_5_ = *(undefined5 *)&plVar17[-1].field_0x7b;
            if (uVar10 <= uVar22) {
              free(&plVar17[-1].implemented);
              break;
            }
            plVar13 = (lysc_must *)((long)&plVar17->ctx + lVar21);
            lVar21 = lVar21 + 0x38;
            lysc_must_free(ctx,plVar13);
            plVar17 = node[1].module;
          } while (plVar17 != (lys_module *)0x0);
        }
        bVar11 = true;
        plVar14 = *(lysc_node **)(node + 1);
        while (plVar14 != (lysc_node *)0x0) {
          plVar7 = plVar14->next;
          lysc_node_free_(ctx,plVar14);
          plVar14 = plVar7;
        }
        goto LAB_0015d865;
      }
    }
switchD_0015d17d_caseD_3:
    ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_free.c"
           ,0x4b1);
LAB_0015d472:
    bVar11 = true;
  }
LAB_0015d865:
  plVar18 = node->exts;
  if (plVar18 != (lysc_ext_instance *)0x0) {
    pvVar23 = (void *)0xffffffffffffffff;
    lVar21 = 0;
    do {
      pvVar23 = (void *)((long)pvVar23 + 1);
      if (plVar18[-1].compiled <= pvVar23) {
        free(&plVar18[-1].compiled);
        break;
      }
      plVar18 = (lysc_ext_instance *)((long)&plVar18->def + lVar21);
      lVar21 = lVar21 + 0x48;
      lysc_ext_instance_free(ctx,plVar18);
      plVar18 = node->exts;
    } while (plVar18 != (lysc_ext_instance *)0x0);
  }
  if (!bVar11) {
    return;
  }
  free(node);
  return;
}

Assistant:

static void
lysc_node_free_(struct lysf_ctx *ctx, struct lysc_node *node)
{
    ly_bool inout = 0;

    /* common part */
    lydict_remove(ctx->ctx, node->name);
    lydict_remove(ctx->ctx, node->dsc);
    lydict_remove(ctx->ctx, node->ref);

    /* nodetype-specific part */
    switch (node->nodetype) {
    case LYS_CONTAINER:
        lysc_node_container_free(ctx, (struct lysc_node_container *)node);
        break;
    case LYS_LEAF:
        lysc_node_leaf_free(ctx, (struct lysc_node_leaf *)node);
        break;
    case LYS_LEAFLIST:
        lysc_node_leaflist_free(ctx, (struct lysc_node_leaflist *)node);
        break;
    case LYS_LIST:
        lysc_node_list_free(ctx, (struct lysc_node_list *)node);
        break;
    case LYS_CHOICE:
        lysc_node_choice_free(ctx, (struct lysc_node_choice *)node);
        break;
    case LYS_CASE:
        lysc_node_case_free(ctx, (struct lysc_node_case *)node);
        break;
    case LYS_ANYDATA:
    case LYS_ANYXML:
        lysc_node_anydata_free(ctx, (struct lysc_node_anydata *)node);
        break;
    case LYS_RPC:
    case LYS_ACTION:
        lysc_node_action_free(ctx, (struct lysc_node_action *)node);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        lysc_node_action_inout_free(ctx, (struct lysc_node_action_inout *)node);
        inout = 1;
        break;
    case LYS_NOTIF:
        lysc_node_notif_free(ctx, (struct lysc_node_notif *)node);
        break;
    default:
        LOGINT(ctx->ctx);
    }

    FREE_ARRAY(ctx, node->exts, lysc_ext_instance_free);

    if (!inout) {
        free(node);
    }
}